

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.hpp
# Opt level: O0

entry * __thiscall libtorrent::entry::operator=(entry *this,char *v)

{
  char *__s;
  allocator<char> local_19;
  char *local_18;
  char *v_local;
  entry *this_local;
  
  local_18 = v;
  v_local = (char *)this;
  destruct(this);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->field_0x30 = this->field_0x30 & 0x80 | 1;
  return this;
}

Assistant:

entry& operator=(U v) &
		{
			destruct();
			new(&data) string_type(std::move(v));
			m_type = string_t;
#if TORRENT_USE_ASSERTS
			m_type_queried = true;
#endif
			return *this;
		}